

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::ComputePipeline::initPrograms(SourceCollections *dst)

{
  allocator<char> local_61;
  string local_60;
  Parameters local_40;
  SourceCollections *local_18;
  SourceCollections *dst_local;
  
  local_18 = dst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"comp",&local_61);
  ShaderModule::Parameters::Parameters(&local_40,VK_SHADER_STAGE_COMPUTE_BIT,&local_60);
  ShaderModule::initPrograms(dst,&local_40);
  ShaderModule::Parameters::~Parameters(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

static void initPrograms (SourceCollections& dst, Parameters)
	{
		ShaderModule::initPrograms(dst, ShaderModule::Parameters(VK_SHADER_STAGE_COMPUTE_BIT, "comp"));
	}